

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::ScalarReplacementPass::GetStorageType(ScalarReplacementPass *this,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  uint32_t typeId;
  uint32_t ptrTypeId;
  Instruction *inst_local;
  ScalarReplacementPass *this_local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpVariable) {
    uVar2 = Instruction::type_id(inst);
    pDVar3 = Pass::get_def_use_mgr((Pass *)this);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
    uVar2 = Instruction::GetSingleWordInOperand(pIVar4,1);
    pDVar3 = Pass::get_def_use_mgr((Pass *)this);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
    return pIVar4;
  }
  __assert_fail("inst->opcode() == spv::Op::OpVariable",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x253,
                "Instruction *spvtools::opt::ScalarReplacementPass::GetStorageType(const Instruction *) const"
               );
}

Assistant:

Instruction* ScalarReplacementPass::GetStorageType(
    const Instruction* inst) const {
  assert(inst->opcode() == spv::Op::OpVariable);

  uint32_t ptrTypeId = inst->type_id();
  uint32_t typeId =
      get_def_use_mgr()->GetDef(ptrTypeId)->GetSingleWordInOperand(1u);
  return get_def_use_mgr()->GetDef(typeId);
}